

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O3

int Ifn_Prepare(Ifn_Ntk_t *p,word *pTruth,int nVars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  Ifn_Obj_t *pIVar6;
  
  iVar3 = p->nInps;
  if (iVar3 < nVars) {
    __assert_fail("nVars <= p->nInps",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                  ,0x76,"int Ifn_Prepare(Ifn_Ntk_t *, word *, int)");
  }
  p->pTruth = pTruth;
  iVar2 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar2 = 1;
  }
  p->nVars = nVars;
  p->nWords = iVar2;
  uVar4 = p->nObjs;
  if (iVar3 < (int)uVar4) {
    pIVar6 = p->Nodes + iVar3;
    lVar5 = (long)(int)uVar4 - (long)iVar3;
    do {
      uVar1 = *(uint *)pIVar6;
      if ((uVar1 & 7) == 6) {
        *(uint *)pIVar6 = uVar1 & 0xffff00fe | (uVar4 & 0xff) << 8;
        uVar4 = uVar4 + (1 << ((byte)uVar1 >> 3));
      }
      pIVar6 = pIVar6 + 1;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  p->nParsVIni = uVar4;
  uVar1 = 0x1f;
  if (nVars - 1U != 0) {
    for (; nVars - 1U >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  iVar2 = (uVar1 ^ 0xffffffe0) + 0x21;
  if ((uint)nVars < 2) {
    iVar2 = nVars;
  }
  p->nParsVNum = iVar2;
  iVar3 = iVar2 * iVar3 + uVar4;
  p->nPars = iVar3;
  if (iVar3 < 0x401) {
    memset(p->Values,0xff,(long)iVar3 << 2);
    return iVar3;
  }
  __assert_fail("p->nPars <= IFN_PAR",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                ,0x89,"int Ifn_Prepare(Ifn_Ntk_t *, word *, int)");
}

Assistant:

int Ifn_Prepare( Ifn_Ntk_t * p, word * pTruth, int nVars )
{
    int i, fVerbose = 0;
    assert( nVars <= p->nInps );
    p->pTruth = pTruth;
    p->nVars  = nVars;
    p->nWords = Abc_TtWordNum(nVars);
    p->nPars  = p->nObjs;
    for ( i = p->nInps; i < p->nObjs; i++ )
    {
        if ( p->Nodes[i].Type != IFN_DSD_PRIME )
            continue;
        p->Nodes[i].iFirst = p->nPars;
        p->nPars += (1 << p->Nodes[i].nFanins);
        if ( fVerbose )
            printf( "Node %d  Start %d  Vars %d\n", i, p->Nodes[i].iFirst, (1 << p->Nodes[i].nFanins) );
    }
    if ( fVerbose )
        printf( "Groups start %d\n", p->nPars );
    p->nParsVIni = p->nPars;
    p->nParsVNum = Abc_Base2Log(nVars);
    p->nPars    += p->nParsVNum * p->nInps;
    assert( p->nPars <= IFN_PAR );
    memset( p->Values, 0xFF, sizeof(int) * p->nPars );
    return p->nPars;
}